

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

bool __thiscall cmCTestMultiProcessHandler::CheckCycles(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_header *p_Var1;
  cmCTest *pcVar2;
  mapped_type *pmVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  mapped_type *ppcVar6;
  ostream *poVar7;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar8;
  int root;
  int test;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  ostringstream cmCTestLog_msg;
  _Rb_tree_color local_270;
  _Rb_tree_color local_26c;
  _Deque_base<int,_std::allocator<int>_> local_268;
  PropertiesMap *local_210;
  _Rb_tree_node_base *local_208;
  TestMap *local_200;
  long *local_1f8;
  long local_1e8 [2];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1d8;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Checking test dependency graph...",0x21);
  std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x586,(char *)local_268._M_impl.super__Deque_impl_data._M_map,this->Quiet);
  if ((iterator *)local_268._M_impl.super__Deque_impl_data._M_map !=
      &local_268._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(local_268._M_impl.super__Deque_impl_data._M_map,
                    (ulong)((long)local_268._M_impl.super__Deque_impl_data._M_start._M_cur + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  p_Var5 = (this->Tests).
           super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_208 = &(this->Tests).
               super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != local_208) {
    local_200 = &this->Tests;
    p_Var1 = &local_1d8._M_impl.super__Rb_tree_header;
    local_210 = &this->Properties;
    do {
      local_270 = p_Var5[1]._M_color;
      local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_268._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_268._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_268._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_268._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_268._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_268._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_268._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_268._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_268._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_268._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_1d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_1d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_268,0);
      if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_268._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                  ((deque<int,std::allocator<int>> *)&local_268,(int *)&local_270);
      }
      else {
        *local_268._M_impl.super__Deque_impl_data._M_finish._M_cur = local_270;
        local_268._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_268._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      while (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_268._M_impl.super__Deque_impl_data._M_start._M_cur) {
        if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_268._M_impl.super__Deque_impl_data._M_finish._M_first) {
          local_26c = local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x7f];
          operator_delete(local_268._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
          local_268._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_268._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_268._M_impl.super__Deque_impl_data._M_finish._M_last =
               (_Elt_pointer)
               ((_Rb_tree_color *)local_268._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80
               );
          local_268._M_impl.super__Deque_impl_data._M_finish._M_cur =
               (_Elt_pointer)
               ((_Rb_tree_color *)local_268._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f
               );
          local_268._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_268._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_26c = local_268._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
          local_268._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_268._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        pVar8 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&local_1d8,(int *)&local_26c);
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pmVar3 = std::
                   map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                   ::operator[](&local_200->
                                 super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                                ,(key_type_conflict *)&local_26c);
          for (p_Var4 = (pmVar3->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
                        super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var4 !=
              &(pmVar3->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
               super__Rb_tree_header; p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)
              ) {
            if (p_Var4[1]._M_color == local_270) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Error: a cycle exists in the test dependency graph for the test \"",0x41);
              ppcVar6 = std::
                        map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                        ::operator[](&local_210->
                                      super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                     ,(key_type_conflict *)&local_270);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,((*ppcVar6)->Name)._M_dataplus._M_p,
                                  ((*ppcVar6)->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"\".\nPlease fix the cycle and run ctest again.\n",0x2d);
              pcVar2 = this->CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                           ,0x599,(char *)local_1f8,false);
              if (local_1f8 != local_1e8) {
                operator_delete(local_1f8,local_1e8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_268);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree(&local_1d8);
              return false;
            }
            if ((_Rb_tree_color *)local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                (_Rb_tree_color *)local_268._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_268,(int *)(p_Var4 + 1));
            }
            else {
              *local_268._M_impl.super__Deque_impl_data._M_finish._M_cur = p_Var4[1]._M_color;
              local_268._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   (_Elt_pointer)
                   ((_Rb_tree_color *)local_268._M_impl.super__Deque_impl_data._M_finish._M_cur + 1)
              ;
            }
          }
        }
      }
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_268);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_1d8);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_208);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Checking test dependency graph end",0x22);
  std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x5a3,(char *)local_268._M_impl.super__Deque_impl_data._M_map,this->Quiet);
  if ((iterator *)local_268._M_impl.super__Deque_impl_data._M_map !=
      &local_268._M_impl.super__Deque_impl_data._M_start) {
    operator_delete(local_268._M_impl.super__Deque_impl_data._M_map,
                    (ulong)((long)local_268._M_impl.super__Deque_impl_data._M_start._M_cur + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return true;
}

Assistant:

bool cmCTestMultiProcessHandler::CheckCycles()
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Checking test dependency graph..." << std::endl,
                     this->Quiet);
  for (auto const& it : this->Tests) {
    // DFS from each element to itself
    int root = it.first;
    std::set<int> visited;
    std::stack<int> s;
    s.push(root);
    while (!s.empty()) {
      int test = s.top();
      s.pop();
      if (visited.insert(test).second) {
        for (auto const& d : this->Tests[test]) {
          if (d == root) {
            // cycle exists
            cmCTestLog(
              this->CTest, ERROR_MESSAGE,
              "Error: a cycle exists in the test dependency graph "
              "for the test \""
                << this->Properties[root]->Name
                << "\".\nPlease fix the cycle and run ctest again.\n");
            return false;
          }
          s.push(d);
        }
      }
    }
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Checking test dependency graph end" << std::endl,
                     this->Quiet);
  return true;
}